

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls_preset_coding_parameters.h
# Opt level: O2

jpegls_pc_parameters *
charls::compute_default
          (jpegls_pc_parameters *__return_storage_ptr__,int32_t maximum_sample_value,
          int32_t near_lossless)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  uint uVar6;
  
  if (maximum_sample_value < 0x10000) {
    if (-1 < near_lossless) {
      iVar3 = 0xff;
      if (maximum_sample_value / 2 < 0xff) {
        iVar3 = maximum_sample_value / 2;
      }
      if (near_lossless <= iVar3) {
        if (maximum_sample_value < 0x80) {
          sVar1 = (short)(0x100 / (long)(maximum_sample_value + 1));
          uVar5 = near_lossless * 3 + (int)(short)(3 / (int)sVar1);
          uVar2 = 2;
          if (2 < (int)uVar5) {
            uVar2 = uVar5;
          }
          uVar4 = near_lossless + 1;
          uVar5 = uVar4;
          if (uVar4 < uVar2) {
            uVar5 = uVar2;
          }
          if (maximum_sample_value < (int)uVar2) {
            uVar5 = uVar4;
          }
          uVar4 = near_lossless * 5 + (int)(short)(7 / (int)sVar1);
          uVar2 = 3;
          if (3 < (int)uVar4) {
            uVar2 = uVar4;
          }
          uVar4 = uVar5;
          if (uVar5 < uVar2) {
            uVar4 = uVar2;
          }
          if (maximum_sample_value < (int)uVar2) {
            uVar4 = uVar5;
          }
          uVar6 = near_lossless * 7 + (int)(short)(0x15 / (int)sVar1);
          uVar2 = 4;
          if (4 < (int)uVar6) {
            uVar2 = uVar6;
          }
          uVar6 = uVar4;
          if (uVar4 < uVar2) {
            uVar6 = uVar2;
          }
          if (maximum_sample_value < (int)uVar2) {
            uVar6 = uVar4;
          }
        }
        else {
          iVar3 = 0xfff;
          if ((uint)maximum_sample_value < 0xfff) {
            iVar3 = maximum_sample_value;
          }
          uVar2 = iVar3 + 0x80U >> 8;
          uVar4 = near_lossless * 3 + uVar2 + 2;
          uVar6 = near_lossless + 1;
          uVar5 = uVar6;
          if (uVar6 < uVar4) {
            uVar5 = uVar4;
          }
          if ((uint)maximum_sample_value < uVar4) {
            uVar5 = uVar6;
          }
          uVar6 = near_lossless * 5 + uVar2 * 4 + 3;
          uVar4 = uVar5;
          if (uVar5 < uVar6) {
            uVar4 = uVar6;
          }
          if ((uint)maximum_sample_value < uVar6) {
            uVar4 = uVar5;
          }
          uVar2 = near_lossless * 7 + uVar2 * 0x11 + 4;
          uVar6 = uVar4;
          if (uVar4 < uVar2) {
            uVar6 = uVar2;
          }
          if ((uint)maximum_sample_value < uVar2) {
            uVar6 = uVar4;
          }
        }
        __return_storage_ptr__->maximum_sample_value = maximum_sample_value;
        __return_storage_ptr__->threshold1 = uVar5;
        __return_storage_ptr__->threshold2 = uVar4;
        __return_storage_ptr__->threshold3 = uVar6;
        __return_storage_ptr__->reset_value = 0x40;
        return __return_storage_ptr__;
      }
    }
    __assertion = 
    "near_lossless >= 0 && near_lossless <= compute_maximum_near_lossless(maximum_sample_value)";
    uVar2 = 0x19;
  }
  else {
    __assertion = "maximum_sample_value <= std::numeric_limits<uint16_t>::max()";
    uVar2 = 0x18;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                ,uVar2,"jpegls_pc_parameters charls::compute_default(const int32_t, const int32_t)")
  ;
}

Assistant:

inline jpegls_pc_parameters compute_default(const int32_t maximum_sample_value, const int32_t near_lossless) noexcept
{
    ASSERT(maximum_sample_value <= std::numeric_limits<uint16_t>::max());
    ASSERT(near_lossless >= 0 && near_lossless <= compute_maximum_near_lossless(maximum_sample_value));

    if (maximum_sample_value >= 128)
    {
        const int32_t factor{(std::min(maximum_sample_value, 4095) + 128) / 256};
        const int threshold1{
            clamp(factor * (default_threshold1 - 2) + 2 + 3 * near_lossless, near_lossless + 1, maximum_sample_value)};
        const int threshold2{
            clamp(factor * (default_threshold2 - 3) + 3 + 5 * near_lossless, threshold1, maximum_sample_value)};

        return {maximum_sample_value, threshold1, threshold2,
                clamp(factor * (default_threshold3 - 4) + 4 + 7 * near_lossless, threshold2, maximum_sample_value),
                default_reset_value};
    }

    const int32_t factor{256 / (maximum_sample_value + 1)};
    const int threshold1{
        clamp(std::max(2, default_threshold1 / factor + 3 * near_lossless), near_lossless + 1, maximum_sample_value)};
    const int threshold2{
        clamp(std::max(3, default_threshold2 / factor + 5 * near_lossless), threshold1, maximum_sample_value)};

    return {maximum_sample_value, threshold1, threshold2,
            clamp(std::max(4, default_threshold3 / factor + 7 * near_lossless), threshold2, maximum_sample_value),
            default_reset_value};
}